

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_282016::PeerManagerImpl::FinalizeNode(PeerManagerImpl *this,CNode *node)

{
  _Base_ptr *pp_Var1;
  size_t *psVar2;
  _Rb_tree_header *p_Var3;
  int *piVar4;
  long lVar5;
  undefined8 *puVar6;
  TxReconciliationTracker *this_00;
  _Link_type this_01;
  long lVar7;
  AddrMan *this_02;
  _Rb_tree_impl<std::less<long>,_true> *p_Var8;
  NodeId NVar9;
  bool bVar10;
  _Self __tmp;
  _Base_ptr p_Var11;
  _Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  *this_03;
  iterator __position;
  _Link_type p_Var12;
  _Link_type p_Var13;
  void *pvVar14;
  size_t sVar15;
  time_point tVar16;
  Logger *this_04;
  _Link_type p_Var17;
  _Link_type __p;
  _Base_ptr p_Var18;
  _Link_type p_Var19;
  _Self __tmp_1;
  _Link_type p_Var20;
  _Base_ptr this_05;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar21;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
  pVar22;
  NodeId nodeid;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock29;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  nodeid = node->id;
  criticalblock28.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock28.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock28.super_unique_lock);
  NVar9 = nodeid;
  criticalblock29.super_unique_lock._M_device = &(this->m_peer_mutex).super_mutex;
  criticalblock29.super_unique_lock._8_8_ =
       criticalblock29.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock(&criticalblock29.super_unique_lock);
  __p = (_Link_type)&(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var11 = (_Base_ptr)__p;
  for (p_Var18 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var18 != (_Base_ptr)0x0; p_Var18 = (&p_Var18->_M_left)[*(long *)(p_Var18 + 1) < NVar9]) {
    if (NVar9 <= *(long *)(p_Var18 + 1)) {
      p_Var11 = p_Var18;
    }
  }
  p_Var18 = (_Base_ptr)__p;
  if (((_Link_type)p_Var11 != __p) && (p_Var18 = p_Var11, NVar9 < *(long *)(p_Var11 + 1))) {
    p_Var18 = (_Base_ptr)__p;
  }
  if ((_Link_type)p_Var18 == __p) {
    this_05 = (_Base_ptr)0x0;
    p_Var11 = (_Base_ptr)0x0;
  }
  else {
    p_Var11 = p_Var18[1]._M_parent;
    this_05 = p_Var18[1]._M_left;
    p_Var18[1]._M_parent = (_Base_ptr)0x0;
    p_Var18[1]._M_left = (_Base_ptr)0x0;
    this_03 = (_Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
               *)std::_Rb_tree_rebalance_for_erase(p_Var18,(_Rb_tree_node_base *)__p);
    std::
    _Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
    ::_M_drop_node(this_03,__p);
    psVar2 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 - 1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock29.super_unique_lock);
  if (p_Var11 == (_Base_ptr)0x0) {
    __assert_fail("peer != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x6ea,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  LOCK();
  (this->m_wtxid_relay_peers).super___atomic_base<int>._M_i =
       (this->m_wtxid_relay_peers).super___atomic_base<int>._M_i -
       (*(byte *)((long)&p_Var11[7]._M_color + 1) & 1);
  UNLOCK();
  if ((this->m_wtxid_relay_peers).super___atomic_base<int>._M_i < 0) {
    __assert_fail("m_wtxid_relay_peers >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x6ec,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  if (this_05 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_05);
  }
  p_Var3 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  p_Var18 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var11 = &p_Var3->_M_header;
  for (; p_Var18 != (_Base_ptr)0x0; p_Var18 = (&p_Var18->_M_left)[*(long *)(p_Var18 + 1) < nodeid])
  {
    if (nodeid <= *(long *)(p_Var18 + 1)) {
      p_Var11 = p_Var18;
    }
  }
  p_Var18 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var11 != p_Var3) && (p_Var18 = p_Var11, nodeid < *(long *)(p_Var11 + 1))
     ) {
    p_Var18 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var18 == p_Var3) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x6ef,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  if ((char)p_Var18[3]._M_color == _S_black) {
    this->nSyncStarted = this->nSyncStarted + -1;
  }
  pp_Var1 = &p_Var18[3]._M_left;
  p_Var11 = p_Var18[3]._M_left;
  if (p_Var11 != (_Base_ptr)pp_Var1) {
    do {
      puVar6 = *(undefined8 **)p_Var11->_M_left;
      if (puVar6 == (undefined8 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      criticalblock29.super_unique_lock._M_device = (mutex_type *)*puVar6;
      criticalblock29.super_unique_lock._8_8_ = puVar6[1];
      pVar21 = std::
               multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
               ::equal_range(&this->mapBlocksInFlight,(key_type *)&criticalblock29);
      __position._M_node = (_Base_ptr)pVar21.first._M_node;
      while (__position._M_node != pVar21.second._M_node._M_node) {
        if (*(long *)(__position._M_node + 2) == nodeid) {
          __position = std::
                       multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                       ::erase_abi_cxx11_((multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                                           *)&this->mapBlocksInFlight,__position);
        }
        else {
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
      }
      p_Var11 = *(_Base_ptr *)p_Var11;
    } while (p_Var11 != (_Base_ptr)pp_Var1);
  }
  criticalblock29.super_unique_lock._8_8_ =
       criticalblock29.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock29.super_unique_lock._M_device = &(this->m_tx_download_mutex).super_mutex;
  std::unique_lock<std::mutex>::lock(&criticalblock29.super_unique_lock);
  TxOrphanage::EraseForPeer(&this->m_orphanage,nodeid);
  p_Var13 = (_Link_type)nodeid;
  TxRequestTracker::DisconnectedPeer(&this->m_txrequest,nodeid);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock29.super_unique_lock);
  this_00 = (this->m_txreconciliation)._M_t.
            super___uniq_ptr_impl<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_>
            ._M_t.
            super__Tuple_impl<0UL,_TxReconciliationTracker_*,_std::default_delete<TxReconciliationTracker>_>
            .super__Head_base<0UL,_TxReconciliationTracker_*,_false>._M_head_impl;
  if (this_00 != (TxReconciliationTracker *)0x0) {
    p_Var13 = (_Link_type)nodeid;
    TxReconciliationTracker::ForgetPeer(this_00,nodeid);
  }
  this->m_num_preferred_download_peers =
       this->m_num_preferred_download_peers - (uint)*(byte *)&p_Var18[4]._M_left;
  piVar4 = &this->m_peers_downloading_from;
  *piVar4 = *piVar4 - (uint)(p_Var18[3]._M_left != (_Base_ptr)pp_Var1);
  if (*piVar4 < 0) {
    __assert_fail("m_peers_downloading_from >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x707,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  piVar4 = &this->m_outbound_peers_with_protect_from_disconnect;
  *piVar4 = *piVar4 - (uint)*(byte *)((long)&p_Var18[5]._M_parent + 1);
  if (*piVar4 < 0) {
    __assert_fail("m_outbound_peers_with_protect_from_disconnect >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x709,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  p_Var3 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  this_01 = (_Link_type)(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
  ;
  p_Var19 = (_Link_type)p_Var3;
  p_Var12 = this_01;
  do {
    p_Var20 = p_Var19;
    if (p_Var12 == (_Link_type)0x0) goto LAB_001d2c6a;
    p_Var18 = *(_Base_ptr *)(p_Var12->_M_storage)._M_storage;
    if ((long)p_Var18 < nodeid) {
      p_Var8 = (_Rb_tree_impl<std::less<long>,_true> *)&p_Var12->super__Rb_tree_node_base;
      p_Var12 = p_Var19;
      p_Var20 = (_Link_type)&p_Var8->super__Rb_tree_header;
    }
    else {
      p_Var20 = p_Var12;
      if ((long)p_Var18 <= nodeid) {
        p_Var17 = (_Link_type)(p_Var12->super__Rb_tree_node_base)._M_right;
        for (p_Var13 = (_Link_type)(p_Var12->super__Rb_tree_node_base)._M_left;
            p_Var13 != (_Link_type)0x0;
            p_Var13 = *(_Link_type *)
                       ((p_Var13->_M_storage)._M_storage + (ulong)(lVar7 < nodeid) * 8 + -0x10)) {
          lVar7 = *(long *)(p_Var13->_M_storage)._M_storage;
          if (nodeid <= lVar7) {
            p_Var12 = p_Var13;
          }
        }
        for (; p_Var20 = p_Var12, p_Var17 != (_Link_type)0x0;
            p_Var17 = *(_Link_type *)((p_Var17->_M_storage)._M_storage + (long)p_Var13 * 8 + -0x10))
        {
          lVar7 = *(long *)(p_Var17->_M_storage)._M_storage;
          p_Var13 = (_Link_type)(ulong)(lVar7 <= nodeid);
          if (nodeid < lVar7) {
            p_Var19 = p_Var17;
          }
        }
LAB_001d2c6a:
        if (((_Link_type)(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             == p_Var20) && ((_Link_type)p_Var3 == p_Var19)) {
          std::
          _Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
          ::_M_erase((_Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
                      *)this_01,p_Var13);
          (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var3->_M_header;
          (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var3->_M_header;
          (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        }
        else {
          while (p_Var20 != p_Var19) {
            p_Var13 = (_Link_type)std::_Rb_tree_increment(&p_Var20->super__Rb_tree_node_base);
            pvVar14 = (void *)std::_Rb_tree_rebalance_for_erase
                                        (&p_Var20->super__Rb_tree_node_base,&p_Var3->_M_header);
            std::__cxx11::
            _List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
            ::~_List_base((_List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                           *)((long)pvVar14 + 0x70));
            operator_delete(pvVar14,0xb8);
            psVar2 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count;
            *psVar2 = *psVar2 - 1;
            p_Var20 = p_Var13;
          }
        }
        if ((this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          if ((this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            __assert_fail("mapBlocksInFlight.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                          ,0x70f,
                          "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                         );
          }
          if (this->m_num_preferred_download_peers != 0) {
            __assert_fail("m_num_preferred_download_peers == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                          ,0x710,
                          "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                         );
          }
          if (this->m_peers_downloading_from != 0) {
            __assert_fail("m_peers_downloading_from == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                          ,0x711,
                          "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                         );
          }
          if (this->m_outbound_peers_with_protect_from_disconnect != 0) {
            __assert_fail("m_outbound_peers_with_protect_from_disconnect == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                          ,0x712,
                          "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                         );
          }
          if ((this->m_wtxid_relay_peers).super___atomic_base<int>._M_i != 0) {
            __assert_fail("m_wtxid_relay_peers == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                          ,0x713,
                          "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                         );
          }
          criticalblock29.super_unique_lock._8_8_ =
               criticalblock29.super_unique_lock._8_8_ & 0xffffffffffffff00;
          criticalblock29.super_unique_lock._M_device = &(this->m_tx_download_mutex).super_mutex;
          std::unique_lock<std::mutex>::lock(&criticalblock29.super_unique_lock);
          sVar15 = TxRequestTracker::Size(&this->m_txrequest);
          if (sVar15 != 0) {
            __assert_fail("m_txrequest.Size() == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                          ,0x715,
                          "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                         );
          }
          if ((this->m_orphanage).m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            __assert_fail("m_orphanage.Size() == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                          ,0x716,
                          "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                         );
          }
          std::unique_lock<std::mutex>::~unique_lock(&criticalblock29.super_unique_lock);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock28.super_unique_lock);
        if ((((node->fSuccessfullyConnected)._M_base._M_i & 1U) != 0) &&
           ((node->m_conn_type & ~BLOCK_RELAY) != INBOUND)) {
          this_02 = this->m_addrman;
          tVar16 = NodeClock::now();
          AddrMan::Connected(this_02,&(node->addr).super_CService,
                             (NodeSeconds)((long)tVar16.__d.__r / 1000000000));
        }
        criticalblock29.super_unique_lock._M_device = &(this->m_headers_presync_mutex).super_mutex;
        criticalblock29.super_unique_lock._8_8_ =
             criticalblock29.super_unique_lock._8_8_ & 0xffffffffffffff00;
        std::unique_lock<std::mutex>::lock(&criticalblock29.super_unique_lock);
        pVar22 = std::
                 _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
                 ::equal_range(&(this->m_headers_presync_stats)._M_t,&nodeid);
        std::
        _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
        ::_M_erase_aux(&(this->m_headers_presync_stats)._M_t,(_Base_ptr)pVar22.first._M_node,
                       (_Base_ptr)pVar22.second._M_node);
        std::unique_lock<std::mutex>::~unique_lock(&criticalblock29.super_unique_lock);
        this_04 = LogInstance();
        bVar10 = BCLog::Logger::WillLogCategoryLevel(this_04,NET,Debug);
        if (bVar10) {
          logging_function._M_str = "FinalizeNode";
          logging_function._M_len = 0xc;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
          ;
          source_file._M_len = 0x62;
          LogPrintFormatInternal<long>
                    (logging_function,source_file,0x724,NET,Debug,
                     (ConstevalFormatString<1U>)0x7ea665,&nodeid);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
          __stack_chk_fail();
        }
        return;
      }
    }
    p_Var19 = p_Var12;
    p_Var12 = *(_Link_type *)((long)p_Var20 + 0x10);
  } while( true );
}

Assistant:

void PeerManagerImpl::FinalizeNode(const CNode& node)
{
    NodeId nodeid = node.GetId();
    {
    LOCK(cs_main);
    {
        // We remove the PeerRef from g_peer_map here, but we don't always
        // destruct the Peer. Sometimes another thread is still holding a
        // PeerRef, so the refcount is >= 1. Be careful not to do any
        // processing here that assumes Peer won't be changed before it's
        // destructed.
        PeerRef peer = RemovePeer(nodeid);
        assert(peer != nullptr);
        m_wtxid_relay_peers -= peer->m_wtxid_relay;
        assert(m_wtxid_relay_peers >= 0);
    }
    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    if (state->fSyncStarted)
        nSyncStarted--;

    for (const QueuedBlock& entry : state->vBlocksInFlight) {
        auto range = mapBlocksInFlight.equal_range(entry.pindex->GetBlockHash());
        while (range.first != range.second) {
            auto [node_id, list_it] = range.first->second;
            if (node_id != nodeid) {
                range.first++;
            } else {
                range.first = mapBlocksInFlight.erase(range.first);
            }
        }
    }
    {
        LOCK(m_tx_download_mutex);
        m_orphanage.EraseForPeer(nodeid);
        m_txrequest.DisconnectedPeer(nodeid);
    }
    if (m_txreconciliation) m_txreconciliation->ForgetPeer(nodeid);
    m_num_preferred_download_peers -= state->fPreferredDownload;
    m_peers_downloading_from -= (!state->vBlocksInFlight.empty());
    assert(m_peers_downloading_from >= 0);
    m_outbound_peers_with_protect_from_disconnect -= state->m_chain_sync.m_protect;
    assert(m_outbound_peers_with_protect_from_disconnect >= 0);

    m_node_states.erase(nodeid);

    if (m_node_states.empty()) {
        // Do a consistency check after the last peer is removed.
        assert(mapBlocksInFlight.empty());
        assert(m_num_preferred_download_peers == 0);
        assert(m_peers_downloading_from == 0);
        assert(m_outbound_peers_with_protect_from_disconnect == 0);
        assert(m_wtxid_relay_peers == 0);
        LOCK(m_tx_download_mutex);
        assert(m_txrequest.Size() == 0);
        assert(m_orphanage.Size() == 0);
    }
    } // cs_main
    if (node.fSuccessfullyConnected &&
        !node.IsBlockOnlyConn() && !node.IsInboundConn()) {
        // Only change visible addrman state for full outbound peers.  We don't
        // call Connected() for feeler connections since they don't have
        // fSuccessfullyConnected set.
        m_addrman.Connected(node.addr);
    }
    {
        LOCK(m_headers_presync_mutex);
        m_headers_presync_stats.erase(nodeid);
    }
    LogDebug(BCLog::NET, "Cleared nodestate for peer=%d\n", nodeid);
}